

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O1

void __thiscall
wasm::
CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
::doEndReturn(CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
              *this,RedundantSetElimination *self,Expression **currp)

{
  CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
  *this_00;
  CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
  *this_01;
  _Base_ptr __from;
  char *__to;
  char *__to_00;
  BasicBlock *lastExit;
  
  this_00 = (CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
             *)(this->branches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  this_01 = (CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
             *)(this->loopLastBlockStack).
               super__Vector_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  (this->loopLastBlockStack).
  super__Vector_base<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this_00 ==
      (CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
       *)0x0) {
    (this->branches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)this_01;
  }
  else {
    if (*(char *)&this[1].
                  super_PostWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>_>
                  .stack.fixed._M_elems[1].func != '\0') {
      link(this_01,(char *)this_00,(char *)currp);
      return;
    }
    __from = (_Base_ptr)operator_new(0x78);
    *(undefined8 *)__from = 0;
    __from->_M_parent = (_Base_ptr)0x0;
    __from->_M_left = (_Base_ptr)0x0;
    __from->_M_right = (_Base_ptr)0x0;
    *(undefined8 *)(__from + 1) = 0;
    __from[1]._M_parent = (_Base_ptr)0x0;
    __from[1]._M_left = (_Base_ptr)0x0;
    __from[1]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)(__from + 2) = 0;
    __from[2]._M_parent = (_Base_ptr)0x0;
    __from[2]._M_left = (_Base_ptr)0x0;
    __from[2]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)(__from + 3) = 0;
    __from[3]._M_parent = (_Base_ptr)0x0;
    __from[3]._M_left = (_Base_ptr)0x0;
    (this->branches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = __from;
    link(this_00,(char *)__from,__to);
    link(this_01,(char *)(this->branches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
         __to_00);
    *(undefined1 *)
     &this[1].
      super_PostWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>_>
      .stack.fixed._M_elems[1].func = 1;
  }
  return;
}

Assistant:

static void doEndReturn(SubType* self, Expression** currp) {
    auto* last = self->currBasicBlock;
    self->startUnreachableBlock();
    if (!self->exit) {
      // This is our first exit block and may be our only exit block, so just
      // set it.
      self->exit = last;
    } else if (!self->hasSyntheticExit) {
      // We now have multiple exit blocks, so we need to create a synthetic one.
      // It will be added to the list of basic blocks at the end of the
      // function.
      auto* lastExit = self->exit;
      self->exit = self->makeBasicBlock();
      self->link(lastExit, self->exit);
      self->link(last, self->exit);
      self->hasSyntheticExit = true;
    } else {
      // We already have a synthetic exit block. Just link it up.
      self->link(last, self->exit);
    }
  }